

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib507.c
# Opt level: O1

int test(char *URL)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined8 uVar5;
  long lVar6;
  long lVar7;
  int *piVar8;
  char *pcVar9;
  long lVar10;
  int iVar11;
  timeval tVar12;
  int still_running;
  int maxfd;
  timeval timeout;
  fd_set fdexcep;
  fd_set fdwrite;
  fd_set fdread;
  int local_1e4;
  long local_1e0;
  int local_1d4;
  undefined8 local_1d0;
  timeval local_1c8;
  fd_set local_1b8;
  fd_set local_138;
  fd_set local_b8;
  
  tv_test_start = tutil_tvnow();
  iVar2 = curl_global_init(3);
  uVar1 = _stderr;
  if (iVar2 == 0) {
    iVar2 = 0;
  }
  else {
    uVar5 = curl_easy_strerror(iVar2);
    curl_mfprintf(uVar1,"%s:%d curl_global_init() failed, with code %d (%s)\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                  ,0x29,iVar2,uVar5);
  }
  if (iVar2 == 0) {
    lVar6 = curl_multi_init();
    iVar4 = 0;
    if (lVar6 == 0) {
      curl_mfprintf(_stderr,"%s:%d curl_multi_init() failed\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                    ,0x2b);
      iVar4 = 0x7b;
    }
    iVar11 = -1;
    iVar2 = -1;
    if (lVar6 == 0) {
      lVar7 = 0;
    }
    else {
      lVar7 = curl_easy_init();
      if (lVar7 == 0) {
        curl_mfprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                      ,0x2d);
        iVar4 = 0x7c;
      }
      else {
        local_1e0 = lVar7;
        iVar3 = curl_easy_setopt(lVar7,0x2712,URL);
        uVar1 = _stderr;
        iVar4 = 0;
        if (iVar3 != 0) {
          uVar5 = curl_easy_strerror(iVar3);
          curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                        ,0x2f,iVar3,uVar5);
          iVar4 = iVar3;
        }
        lVar7 = local_1e0;
        if (iVar4 == 0) {
          iVar3 = curl_easy_setopt(local_1e0,0x2a,1);
          uVar1 = _stderr;
          iVar4 = 0;
          if (iVar3 != 0) {
            uVar5 = curl_easy_strerror(iVar3);
            curl_mfprintf(uVar1,"%s:%d curl_easy_setopt() failed, with code %d (%s)\n",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                          ,0x30,iVar3,uVar5);
            iVar4 = iVar3;
          }
          lVar7 = local_1e0;
          if (iVar4 == 0) {
            iVar4 = curl_multi_add_handle(lVar6,local_1e0);
            uVar1 = _stderr;
            if (iVar4 == 0) {
              iVar4 = 0;
            }
            else {
              uVar5 = curl_multi_strerror(iVar4);
              curl_mfprintf(uVar1,"%s:%d curl_multi_add_handle() failed, with code %d (%s)\n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                            ,0x32,iVar4,uVar5);
            }
            lVar7 = local_1e0;
            if (iVar4 == 0) {
              iVar4 = curl_multi_perform(lVar6,&local_1e4);
              uVar1 = _stderr;
              if (iVar4 == 0) {
                iVar4 = 0;
                if (local_1e4 < 0) {
                  curl_mfprintf(_stderr,
                                "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                ,0x34);
                  iVar4 = 0x7a;
                }
              }
              else {
                uVar5 = curl_multi_strerror(iVar4);
                curl_mfprintf(uVar1,"%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                              ,0x34,iVar4,uVar5);
              }
              lVar7 = local_1e0;
              if (iVar4 == 0) {
                tVar12 = tutil_tvnow();
                lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                if (lVar7 < 0xea61) {
                  iVar4 = 0;
                  do {
                    if (local_1e4 == 0) {
                      lVar10 = curl_multi_info_read(lVar6,&local_1e4);
                      lVar7 = local_1e0;
                      if (lVar10 != 0) {
                        iVar11 = *(int *)(lVar10 + 0x10);
                      }
                      goto LAB_001028f8;
                    }
                    local_1d4 = -99;
                    local_b8.__fds_bits[0] = 0;
                    local_b8.__fds_bits[1] = 0;
                    local_b8.__fds_bits[2] = 0;
                    local_b8.__fds_bits[3] = 0;
                    local_b8.__fds_bits[4] = 0;
                    local_b8.__fds_bits[5] = 0;
                    local_b8.__fds_bits[6] = 0;
                    local_b8.__fds_bits[7] = 0;
                    local_b8.__fds_bits[8] = 0;
                    local_b8.__fds_bits[9] = 0;
                    local_b8.__fds_bits[10] = 0;
                    local_b8.__fds_bits[0xb] = 0;
                    local_b8.__fds_bits[0xc] = 0;
                    local_b8.__fds_bits[0xd] = 0;
                    local_b8.__fds_bits[0xe] = 0;
                    local_b8.__fds_bits[0xf] = 0;
                    local_138.__fds_bits[0] = 0;
                    local_138.__fds_bits[1] = 0;
                    local_138.__fds_bits[2] = 0;
                    local_138.__fds_bits[3] = 0;
                    local_138.__fds_bits[4] = 0;
                    local_138.__fds_bits[5] = 0;
                    local_138.__fds_bits[6] = 0;
                    local_138.__fds_bits[7] = 0;
                    local_138.__fds_bits[8] = 0;
                    local_138.__fds_bits[9] = 0;
                    local_138.__fds_bits[10] = 0;
                    local_138.__fds_bits[0xb] = 0;
                    local_138.__fds_bits[0xc] = 0;
                    local_138.__fds_bits[0xd] = 0;
                    local_138.__fds_bits[0xe] = 0;
                    local_138.__fds_bits[0xf] = 0;
                    local_1b8.__fds_bits[0xe] = 0;
                    local_1b8.__fds_bits[0xf] = 0;
                    local_1b8.__fds_bits[0xc] = 0;
                    local_1b8.__fds_bits[0xd] = 0;
                    local_1b8.__fds_bits[10] = 0;
                    local_1b8.__fds_bits[0xb] = 0;
                    local_1b8.__fds_bits[8] = 0;
                    local_1b8.__fds_bits[9] = 0;
                    local_1b8.__fds_bits[6] = 0;
                    local_1b8.__fds_bits[7] = 0;
                    local_1b8.__fds_bits[4] = 0;
                    local_1b8.__fds_bits[5] = 0;
                    local_1b8.__fds_bits[2] = 0;
                    local_1b8.__fds_bits[3] = 0;
                    local_1b8.__fds_bits[0] = 0;
                    local_1b8.__fds_bits[1] = 0;
                    local_1c8.tv_sec = 1;
                    local_1c8.tv_usec = 0;
                    iVar3 = curl_multi_fdset(lVar6,&local_b8,&local_138,&local_1b8,&local_1d4);
                    uVar1 = _stderr;
                    if (iVar3 == 0) {
                      if (local_1d4 < -1) {
                        curl_mfprintf(_stderr,
                                      "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n"
                                      ,
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                      ,0x45);
                        iVar4 = 0x7a;
                      }
                    }
                    else {
                      uVar5 = curl_multi_strerror(iVar3);
                      curl_mfprintf(uVar1,"%s:%d curl_multi_fdset() failed, with code %d (%s)\n",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                    ,0x45,iVar3,uVar5);
                      iVar4 = iVar3;
                    }
                    iVar3 = 0xc;
                    if (iVar4 == 0) {
                      iVar4 = select_wrapper(local_1d4 + 1,&local_b8,&local_138,&local_1b8,
                                             &local_1c8);
                      if (iVar4 == -1) {
                        piVar8 = __errno_location();
                        iVar4 = *piVar8;
                        local_1d0 = _stderr;
                        pcVar9 = strerror(iVar4);
                        curl_mfprintf(local_1d0,"%s:%d select() failed, with errno %d (%s)\n",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                      ,0x49,iVar4,pcVar9);
                        iVar4 = 0x79;
                      }
                      else {
                        tVar12 = tutil_tvnow();
                        lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                        if (lVar7 < 0xea61) {
                          iVar4 = curl_multi_perform(lVar6,&local_1e4);
                          uVar1 = _stderr;
                          if (iVar4 == 0) {
                            iVar4 = 0;
                            if (local_1e4 < 0) {
                              curl_mfprintf(_stderr,
                                            "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                            ,0x4d);
                              iVar4 = 0x7a;
                            }
                          }
                          else {
                            uVar5 = curl_multi_strerror(iVar4);
                            curl_mfprintf(uVar1,
                                          "%s:%d curl_multi_perform() failed, with code %d (%s)\n",
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                          ,0x4d,iVar4,uVar5);
                          }
                          if (iVar4 == 0) {
                            tVar12 = tutil_tvnow();
                            lVar7 = tutil_tvdiff(tVar12,tv_test_start);
                            iVar3 = 0;
                            iVar4 = 0;
                            if (60000 < lVar7) {
                              curl_mfprintf(_stderr,
                                            "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                            ,
                                            "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                            ,0x4f);
                              iVar4 = 0x7d;
                              iVar3 = 0xc;
                            }
                          }
                        }
                        else {
                          curl_mfprintf(_stderr,
                                        "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                        ,0x4b);
                          iVar4 = 0x7d;
                        }
                      }
                    }
                  } while (iVar3 == 0);
                  lVar7 = local_1e0;
                  if (iVar3 != 0xc) goto LAB_00102912;
                }
                else {
                  curl_mfprintf(_stderr,
                                "%s:%d ABORTING TEST, since it seems that it would have run forever.\n"
                                ,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/kfalconspb[P]curl/tests/libtest/lib507.c"
                                ,0x36);
                  iVar4 = 0x7d;
                  lVar7 = local_1e0;
                }
              }
            }
          }
        }
      }
    }
LAB_001028f8:
    curl_multi_cleanup(lVar6);
    curl_easy_cleanup(lVar7);
    curl_global_cleanup();
    iVar2 = iVar11;
    if (iVar4 != 0) {
      iVar2 = iVar4;
    }
  }
LAB_00102912:
  return iVar2;
}

Assistant:

int test(char *URL)
{
  CURL *curls = NULL;
  CURLM *multi = NULL;
  int still_running;
  int i = -1;
  int res = 0;
  CURLMsg *msg;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(multi);

  easy_init(curls);

  easy_setopt(curls, CURLOPT_URL, URL);
  easy_setopt(curls, CURLOPT_HEADER, 1L);

  multi_add_handle(multi, curls);

  multi_perform(multi, &still_running);

  abort_on_test_timeout();

  while(still_running) {
    struct timeval timeout;
    fd_set fdread;
    fd_set fdwrite;
    fd_set fdexcep;
    int maxfd = -99;

    FD_ZERO(&fdread);
    FD_ZERO(&fdwrite);
    FD_ZERO(&fdexcep);
    timeout.tv_sec = 1;
    timeout.tv_usec = 0;

    multi_fdset(multi, &fdread, &fdwrite, &fdexcep, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd + 1, &fdread, &fdwrite, &fdexcep, &timeout);

    abort_on_test_timeout();

    multi_perform(multi, &still_running);

    abort_on_test_timeout();
  }

  msg = curl_multi_info_read(multi, &still_running);
  if(msg)
    /* this should now contain a result code from the easy handle,
       get it */
    i = msg->data.result;

test_cleanup:

  /* undocumented cleanup sequence - type UA */

  curl_multi_cleanup(multi);
  curl_easy_cleanup(curls);
  curl_global_cleanup();

  if(res)
    i = res;

  return i; /* return the final return code */
}